

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

time_t cm_get_date(time_t now,char *p)

{
  long lVar1;
  int iVar2;
  tm *ptVar3;
  time_t tVar4;
  time_t local_1160;
  long local_1158;
  long tzone;
  time_t tod;
  time_t Start;
  tm *gmt_ptr;
  tm gmt;
  tm *tm;
  tm local;
  gdstate *gds;
  token *lasttoken;
  gdstate _gds;
  token tokens [256];
  char *local_20;
  char *p_local;
  time_t now_local;
  
  local_20 = p;
  p_local = (char *)now;
  memset(&_gds.RelSeconds,0,0x1000);
  memset(&lasttoken,0,0x88);
  local.__tm_zone = (char *)&lasttoken;
  memset(&tm,0,0x38);
  gmt.__tm_zone = (char *)localtime((time_t *)&p_local);
  if ((tm *)gmt.__tm_zone == (tm *)0x0) {
    return -1;
  }
  memcpy(&tm,gmt.__tm_zone,0x38);
  memset(&gmt_ptr,0,0x38);
  ptVar3 = gmtime((time_t *)&p_local);
  if (ptVar3 == (tm *)0x0) {
    local_1158 = 0;
  }
  else {
    memcpy(&gmt_ptr,ptVar3,0x38);
    local_1158 = difftm((tm *)&gmt_ptr,(tm *)&tm);
  }
  if (local.tm_wday != 0) {
    local_1158 = local_1158 + 0xe10;
  }
  gds = (gdstate *)&_gds.RelSeconds;
  while( true ) {
    iVar2 = nexttoken(&local_20,(time_t *)&gds->HaveYear);
    *(int *)&gds->tokenp = iVar2;
    if (iVar2 == 0) break;
    gds = (gdstate *)&gds->HaveDay;
    if (&tokens[0xfe].value < gds) {
      return -1;
    }
  }
  *(time_t **)local.__tm_zone = &_gds.RelSeconds;
  while (*(gdstate **)local.__tm_zone < gds) {
    iVar2 = phrase((gdstate *)local.__tm_zone);
    if (iVar2 == 0) {
      return -1;
    }
  }
  if (*(int *)(local.__tm_zone + 0x1c) == 0) {
    *(long *)(local.__tm_zone + 0x28) = local_1158;
    local.__tm_zone[0x60] = '\x02';
    local.__tm_zone[0x61] = '\0';
    local.__tm_zone[0x62] = '\0';
    local.__tm_zone[99] = '\0';
  }
  if ((*(int *)(local.__tm_zone + 0x1c) != 0) && (ptVar3 != (tm *)0x0)) {
    p_local = p_local + -*(long *)(local.__tm_zone + 0x28);
    ptVar3 = gmtime((time_t *)&p_local);
    if (ptVar3 != (tm *)0x0) {
      memcpy(&tm,ptVar3,0x38);
    }
    p_local = p_local + *(long *)(local.__tm_zone + 0x28);
  }
  if (*(int *)(local.__tm_zone + 8) == 0) {
    *(long *)(local.__tm_zone + 0x58) = (long)(local.tm_mday + 0x76c);
  }
  if (*(int *)(local.__tm_zone + 0xc) == 0) {
    *(long *)(local.__tm_zone + 0x48) = (long)(local.tm_hour + 1);
  }
  if (*(int *)(local.__tm_zone + 0x10) == 0) {
    *(long *)(local.__tm_zone + 0x30) = (long)local.tm_min;
  }
  if ((((*(int *)(local.__tm_zone + 0x18) < 2) && (*(int *)(local.__tm_zone + 0x1c) < 2)) &&
      (*(int *)(local.__tm_zone + 0x14) < 2)) &&
     (((*(int *)(local.__tm_zone + 8) < 2 && (*(int *)(local.__tm_zone + 0xc) < 2)) &&
      (*(int *)(local.__tm_zone + 0x10) < 2)))) {
    if (((*(int *)(local.__tm_zone + 8) == 0) && (*(int *)(local.__tm_zone + 0xc) == 0)) &&
       ((*(int *)(local.__tm_zone + 0x10) == 0 &&
        ((*(int *)(local.__tm_zone + 0x18) == 0 && (*(int *)(local.__tm_zone + 0x14) == 0)))))) {
      tod = (time_t)p_local;
      if (*(int *)(local.__tm_zone + 0x20) == 0) {
        tod = (long)p_local - ((long)local.tm_sec * 0xe10 + (long)tm._4_4_ * 0x3c + (long)(int)tm);
      }
    }
    else {
      tod = Convert(*(time_t *)(local.__tm_zone + 0x48),*(time_t *)(local.__tm_zone + 0x30),
                    *(time_t *)(local.__tm_zone + 0x58),*(time_t *)(local.__tm_zone + 0x38),
                    *(time_t *)(local.__tm_zone + 0x40),*(time_t *)(local.__tm_zone + 0x50),
                    *(time_t *)(local.__tm_zone + 0x28),*(DSTMODE *)(local.__tm_zone + 0x60));
      if (tod < 0) {
        return -1;
      }
    }
    lVar1 = *(long *)(local.__tm_zone + 0x80);
    tVar4 = RelativeMonth(lVar1 + tod,*(time_t *)(local.__tm_zone + 0x28),
                          *(time_t *)(local.__tm_zone + 0x78));
    tod = tVar4 + lVar1 + tod;
    if ((((*(int *)(local.__tm_zone + 0x14) != 0) && (*(int *)(local.__tm_zone + 8) == 0)) &&
        (*(int *)(local.__tm_zone + 0xc) == 0)) && (*(int *)(local.__tm_zone + 0x10) == 0)) {
      tVar4 = RelativeDate(tod,*(time_t *)(local.__tm_zone + 0x28),*(int *)(local.__tm_zone + 0x60),
                           *(time_t *)(local.__tm_zone + 0x68),*(time_t *)(local.__tm_zone + 0x70));
      tod = tVar4 + tod;
    }
    if (tod == -1) {
      local_1160 = 0;
    }
    else {
      local_1160 = tod;
    }
    return local_1160;
  }
  return -1;
}

Assistant:

time_t
__archive_get_date(time_t now, const char *p)
{
	struct token	tokens[256];
	struct gdstate	_gds;
	struct token	*lasttoken;
	struct gdstate	*gds;
	struct tm	local, *tm;
	struct tm	gmt, *gmt_ptr;
	time_t		Start;
	time_t		tod;
	long		tzone;
#if defined(HAVE__LOCALTIME64_S) || defined(HAVE__GMTIME64_S)
	errno_t		terr;
	__time64_t	tmptime;
#endif

	/* Clear out the parsed token array. */
	memset(tokens, 0, sizeof(tokens));
	/* Initialize the parser state. */
	memset(&_gds, 0, sizeof(_gds));
	gds = &_gds;

	/* Look up the current time. */
#if defined(HAVE_LOCALTIME_R)
	tm = localtime_r(&now, &local);
#elif defined(HAVE__LOCALTIME64_S)
	tmptime = now;
	terr = _localtime64_s(&local, &tmptime);
	if (terr)
		tm = NULL;
	else
		tm = &local;
#else
	memset(&local, 0, sizeof(local));
	tm = localtime(&now);
#endif
	if (tm == NULL)
		return -1;
#if !defined(HAVE_LOCALTIME_R) && !defined(HAVE__LOCALTIME64_S)
	local = *tm;
#endif

	/* Look up UTC if we can and use that to determine the current
	 * timezone offset. */
#if defined(HAVE_GMTIME_R)
	gmt_ptr = gmtime_r(&now, &gmt);
#elif defined(HAVE__GMTIME64_S)
	tmptime = now;
	terr = _gmtime64_s(&gmt, &tmptime);
	if (terr)
		gmt_ptr = NULL;
	else
		gmt_ptr = &gmt;
#else
	memset(&gmt, 0, sizeof(gmt));
	gmt_ptr = gmtime(&now);
	if (gmt_ptr != NULL) {
		/* Copy, in case localtime and gmtime use the same buffer. */
		gmt = *gmt_ptr;
	}
#endif
	if (gmt_ptr != NULL)
		tzone = difftm (&gmt, &local);
	else
		/* This system doesn't understand timezones; fake it. */
		tzone = 0;
	if(local.tm_isdst)
		tzone += HOUR;

	/* Tokenize the input string. */
	lasttoken = tokens;
	while ((lasttoken->token = nexttoken(&p, &lasttoken->value)) != 0) {
		++lasttoken;
		if (lasttoken > tokens + 255)
			return -1;
	}
	gds->tokenp = tokens;

	/* Match phrases until we run out of input tokens. */
	while (gds->tokenp < lasttoken) {
		if (!phrase(gds))
			return -1;
	}

	/* Use current local timezone if none was specified. */
	if (!gds->HaveZone) {
		gds->Timezone = tzone;
		gds->DSTmode = DSTmaybe;
	}

	/* If a timezone was specified, use that for generating the default
	 * time components instead of the local timezone. */
	if (gds->HaveZone && gmt_ptr != NULL) {
		now -= gds->Timezone;
#if defined(HAVE_GMTIME_R)
		gmt_ptr = gmtime_r(&now, &gmt);
#elif defined(HAVE__GMTIME64_S)
		tmptime = now;
		terr = _gmtime64_s(&gmt, &tmptime);
		if (terr)
			gmt_ptr = NULL;
		else
			gmt_ptr = &gmt;
#else
		gmt_ptr = gmtime(&now);
#endif
		if (gmt_ptr != NULL)
			local = *gmt_ptr;
		now += gds->Timezone;
	}

	if (!gds->HaveYear)
		gds->Year = local.tm_year + 1900;
	if (!gds->HaveMonth)
		gds->Month = local.tm_mon + 1;
	if (!gds->HaveDay)
		gds->Day = local.tm_mday;
	/* Note: No default for hour/min/sec; a specifier that just
	 * gives date always refers to 00:00 on that date. */

	/* If we saw more than one time, timezone, weekday, year, month,
	 * or day, then give up. */
	if (gds->HaveTime > 1 || gds->HaveZone > 1 || gds->HaveWeekDay > 1
	    || gds->HaveYear > 1 || gds->HaveMonth > 1 || gds->HaveDay > 1)
		return -1;

	/* Compute an absolute time based on whatever absolute information
	 * we collected. */
	if (gds->HaveYear || gds->HaveMonth || gds->HaveDay
	    || gds->HaveTime || gds->HaveWeekDay) {
		Start = Convert(gds->Month, gds->Day, gds->Year,
		    gds->Hour, gds->Minutes, gds->Seconds,
		    gds->Timezone, gds->DSTmode);
		if (Start < 0)
			return -1;
	} else {
		Start = now;
		if (!gds->HaveRel)
			Start -= local.tm_hour * HOUR + local.tm_min * MINUTE
			    + local.tm_sec;
	}

	/* Add the relative offset. */
	Start += gds->RelSeconds;
	Start += RelativeMonth(Start, gds->Timezone, gds->RelMonth);

	/* Adjust for day-of-week offsets. */
	if (gds->HaveWeekDay
	    && !(gds->HaveYear || gds->HaveMonth || gds->HaveDay)) {
		tod = RelativeDate(Start, gds->Timezone,
		    gds->DSTmode, gds->DayOrdinal, gds->DayNumber);
		Start += tod;
	}

	/* -1 is an error indicator, so return 0 instead of -1 if
	 * that's the actual time. */
	return Start == -1 ? 0 : Start;
}